

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::complete(Calendar *this,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  Calendar *this_local;
  
  if (this->fIsTimeSet == '\0') {
    updateTime(this,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') {
      return;
    }
  }
  if (this->fAreFieldsSet == '\0') {
    (*(this->super_UObject)._vptr_UObject[0x1d])(this,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      this->fAreFieldsSet = '\x01';
      this->fAreAllFieldsSet = '\x01';
    }
  }
  return;
}

Assistant:

void
Calendar::complete(UErrorCode& status)
{
    if (!fIsTimeSet) {
        updateTime(status);
        /* Test for buffer overflows */
        if(U_FAILURE(status)) {
            return;
        }
    }
    if (!fAreFieldsSet) {
        computeFields(status); // fills in unset fields
        /* Test for buffer overflows */
        if(U_FAILURE(status)) {
            return;
        }
        fAreFieldsSet         = TRUE;
        fAreAllFieldsSet     = TRUE;
    }
}